

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaCloneWildcardNsConstraints
              (xmlSchemaParserCtxtPtr ctxt,xmlSchemaWildcardPtr dest,xmlSchemaWildcardPtr source)

{
  xmlSchemaWildcardNsPtr pxVar1;
  xmlSchemaWildcardNsPtr local_40;
  xmlSchemaWildcardNsPtr last;
  xmlSchemaWildcardNsPtr tmp;
  xmlSchemaWildcardNsPtr cur;
  xmlSchemaWildcardPtr source_local;
  xmlSchemaWildcardPtr dest_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  if ((source == (xmlSchemaWildcardPtr)0x0) || (dest == (xmlSchemaWildcardPtr)0x0)) {
    ctxt_local._4_4_ = -1;
  }
  else {
    dest->any = source->any;
    tmp = source->nsSet;
    local_40 = (xmlSchemaWildcardNsPtr)0x0;
    for (; tmp != (xmlSchemaWildcardNsPtr)0x0; tmp = tmp->next) {
      pxVar1 = xmlSchemaNewWildcardNsConstraint(ctxt);
      if (pxVar1 == (xmlSchemaWildcardNsPtr)0x0) {
        return -1;
      }
      pxVar1->value = tmp->value;
      if (local_40 == (xmlSchemaWildcardNsPtr)0x0) {
        dest->nsSet = pxVar1;
      }
      else {
        local_40->next = pxVar1;
      }
      local_40 = pxVar1;
    }
    if (dest->negNsSet != (xmlSchemaWildcardNsPtr)0x0) {
      xmlSchemaFreeWildcardNsSet(dest->negNsSet);
    }
    if (source->negNsSet == (xmlSchemaWildcardNsPtr)0x0) {
      dest->negNsSet = (xmlSchemaWildcardNsPtr)0x0;
    }
    else {
      pxVar1 = xmlSchemaNewWildcardNsConstraint(ctxt);
      dest->negNsSet = pxVar1;
      if (dest->negNsSet == (xmlSchemaWildcardNsPtr)0x0) {
        return -1;
      }
      dest->negNsSet->value = source->negNsSet->value;
    }
    ctxt_local._4_4_ = 0;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlSchemaCloneWildcardNsConstraints(xmlSchemaParserCtxtPtr ctxt,
				    xmlSchemaWildcardPtr dest,
				    xmlSchemaWildcardPtr source)
{
    xmlSchemaWildcardNsPtr cur, tmp, last;

    if ((source == NULL) || (dest == NULL))
	return(-1);
    dest->any = source->any;
    cur = source->nsSet;
    last = NULL;
    while (cur != NULL) {
	tmp = xmlSchemaNewWildcardNsConstraint(ctxt);
	if (tmp == NULL)
	    return(-1);
	tmp->value = cur->value;
	if (last == NULL)
	    dest->nsSet = tmp;
	else
	    last->next = tmp;
	last = tmp;
	cur = cur->next;
    }
    if (dest->negNsSet != NULL)
	xmlSchemaFreeWildcardNsSet(dest->negNsSet);
    if (source->negNsSet != NULL) {
	dest->negNsSet = xmlSchemaNewWildcardNsConstraint(ctxt);
	if (dest->negNsSet == NULL)
	    return(-1);
	dest->negNsSet->value = source->negNsSet->value;
    } else
	dest->negNsSet = NULL;
    return(0);
}